

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

TableInterfaceInfo * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getTableInterfaceInfo
          (TableInterfaceInfo *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          Name name)

{
  bool bVar1;
  Importable *this_00;
  __shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar2;
  long lVar3;
  Name NVar4;
  Name NVar5;
  Export *tableExport;
  mapped_type *importedInstance;
  Table *table;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  Name name_local;
  
  NVar4.super_IString.str._M_str = name.super_IString.str._M_len;
  NVar4.super_IString.str._M_len = (size_t)this->wasm;
  this_00 = (Importable *)::wasm::Module::getTable(NVar4);
  bVar1 = Importable::imported(this_00);
  if (bVar1) {
    this_01 = (__shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
              ::at(&this->linkedInstances,&this_00->module);
    peVar2 = std::__shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_01);
    NVar5.super_IString.str._M_str = (char *)(this_00->base).super_IString.str._M_len;
    NVar5.super_IString.str._M_len =
         (size_t)(peVar2->super_ModuleRunnerBase<wasm::ModuleRunner>).wasm;
    lVar3 = ::wasm::Module::getExport(NVar5);
    peVar2 = std::__shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_01);
    __return_storage_ptr__->interface =
         (peVar2->super_ModuleRunnerBase<wasm::ModuleRunner>).externalInterface;
    (__return_storage_ptr__->name).super_IString.str._M_len = *(size_t *)(lVar3 + 0x10);
    (__return_storage_ptr__->name).super_IString.str._M_str = *(char **)(lVar3 + 0x18);
  }
  else {
    __return_storage_ptr__->interface = this->externalInterface;
    (__return_storage_ptr__->name).super_IString.str._M_len = (size_t)name.super_IString.str._M_len;
    (__return_storage_ptr__->name).super_IString.str._M_str = name.super_IString.str._M_str;
  }
  return __return_storage_ptr__;
}

Assistant:

TableInterfaceInfo getTableInterfaceInfo(Name name) {
    auto* table = wasm.getTable(name);
    if (table->imported()) {
      auto& importedInstance = linkedInstances.at(table->module);
      auto* tableExport = importedInstance->wasm.getExport(table->base);
      return TableInterfaceInfo{importedInstance->externalInterface,
                                tableExport->value};
    } else {
      return TableInterfaceInfo{externalInterface, name};
    }
  }